

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O3

void slang::iterDirectoriesRecursive
               (path *path,SmallVector<std::filesystem::__cxx11::path,_2UL> *results,
               flat_hash_set<std::string> *visited)

{
  size_t *psVar1;
  pointer ppVar2;
  group_type_pointer pgVar3;
  path *ppVar4;
  group_type_pointer pgVar5;
  value_type_pointer pbVar6;
  ulong uVar7;
  byte bVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  byte bVar12;
  _Alloc_hider __s1;
  size_type __n;
  int iVar13;
  uint uVar14;
  uint64_t hash;
  ulong uVar15;
  path *ctx;
  ulong pos0;
  long lVar16;
  ulong uVar17;
  pointer ppVar18;
  undefined1 auVar19 [16];
  error_code ec;
  path canonical;
  locator res;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local;
  path local_d8;
  locator local_b0;
  SmallVector<std::filesystem::__cxx11::path,_2UL> local_98;
  
  local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  iterDirectory(path,&local_98,Directories);
  ctx = (path *)(local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.len +
                (results->super_SmallVectorBase<std::filesystem::__cxx11::path>).len);
  SmallVectorBase<std::filesystem::__cxx11::path>::reserve
            (&results->super_SmallVectorBase<std::filesystem::__cxx11::path>,(size_type)ctx);
  ppVar18 = local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_;
  if (local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.len != 0) {
    ppVar2 = local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
             local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
    std::_V2::system_category();
    do {
      std::filesystem::weakly_canonical(&local_d8,(error_code *)ppVar18);
      hash = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                           *)visited,&local_d8._M_pathname);
      __n = local_d8._M_pathname._M_string_length;
      __s1._M_p = local_d8._M_pathname._M_dataplus._M_p;
      pos0 = hash >> ((byte)(visited->table_).
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                            .arrays.groups_size_index & 0x3f);
      pgVar5 = (visited->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
               .arrays.groups_;
      lVar16 = (hash & 0xff) * 4;
      uVar9 = (&UNK_004a938c)[lVar16];
      uVar10 = (&UNK_004a938d)[lVar16];
      uVar11 = (&UNK_004a938e)[lVar16];
      bVar12 = (&UNK_004a938f)[lVar16];
      pbVar6 = (visited->table_).
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
               .arrays.elements_;
      uVar7 = (visited->table_).
              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
              .arrays.groups_size_mask;
      uVar15 = 0;
      uVar17 = pos0;
      do {
        pgVar3 = pgVar5 + uVar17;
        bVar8 = pgVar3->m[0xf].n;
        auVar19[0] = -(pgVar3->m[0].n == uVar9);
        auVar19[1] = -(pgVar3->m[1].n == uVar10);
        auVar19[2] = -(pgVar3->m[2].n == uVar11);
        auVar19[3] = -(pgVar3->m[3].n == bVar12);
        auVar19[4] = -(pgVar3->m[4].n == uVar9);
        auVar19[5] = -(pgVar3->m[5].n == uVar10);
        auVar19[6] = -(pgVar3->m[6].n == uVar11);
        auVar19[7] = -(pgVar3->m[7].n == bVar12);
        auVar19[8] = -(pgVar3->m[8].n == uVar9);
        auVar19[9] = -(pgVar3->m[9].n == uVar10);
        auVar19[10] = -(pgVar3->m[10].n == uVar11);
        auVar19[0xb] = -(pgVar3->m[0xb].n == bVar12);
        auVar19[0xc] = -(pgVar3->m[0xc].n == uVar9);
        auVar19[0xd] = -(pgVar3->m[0xd].n == uVar10);
        auVar19[0xe] = -(pgVar3->m[0xe].n == uVar11);
        auVar19[0xf] = -(bVar8 == bVar12);
        uVar14 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
        if (uVar14 != 0) {
          ppVar4 = (path *)(pbVar6 + uVar17 * 0xf);
          do {
            iVar13 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> iVar13 & 1) == 0; iVar13 = iVar13 + 1) {
              }
            }
            if (__n == *(size_t *)
                        ((long)&(ppVar4->_M_pathname)._M_string_length + (ulong)(uint)(iVar13 << 5))
               ) {
              ctx = ppVar4;
              if (__n == 0) goto LAB_0021e1ae;
              ctx = *(path **)((long)&(ppVar4->_M_pathname)._M_dataplus._M_p +
                              (ulong)(uint)(iVar13 << 5));
              iVar13 = bcmp(__s1._M_p,ctx,__n);
              if (iVar13 == 0) goto LAB_0021e1ae;
            }
            uVar14 = uVar14 - 1 & uVar14;
          } while (uVar14 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)hash & 7] & bVar8) == 0) break;
        lVar16 = uVar17 + uVar15;
        uVar15 = uVar15 + 1;
        uVar17 = lVar16 + 1U & uVar7;
      } while (uVar15 <= uVar7);
      if ((visited->table_).
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
          .size_ctrl.size <
          (visited->table_).
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::nosize_unchecked_emplace_at<std::__cxx11::string_const&>
                  (&local_b0,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)visited,(arrays_type *)visited,pos0,hash,&local_d8._M_pathname);
        psVar1 = &(visited->table_).
                  super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::__cxx11::basic_string<char>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::__cxx11::basic_string<char>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::unchecked_emplace_with_rehash<std::__cxx11::string_const&>
                  (&local_b0,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::__cxx11::string>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)visited,hash,&local_d8._M_pathname);
      }
      iterDirectoriesRecursive(&local_d8,results,visited);
      ctx = &local_d8;
      SmallVectorBase<std::filesystem::__cxx11::path>::emplace_back<std::filesystem::__cxx11::path>
                (&results->super_SmallVectorBase<std::filesystem::__cxx11::path>,&local_d8);
LAB_0021e1ae:
      std::filesystem::__cxx11::path::~path(&local_d8);
      ppVar18 = ppVar18 + 1;
    } while (ppVar18 != ppVar2);
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&local_98.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

static void iterDirectoriesRecursive(const fs::path& path, SmallVector<fs::path>& results,
                                     flat_hash_set<std::string>& visited) {
    SmallVector<fs::path> local;
    iterDirectory(path, local, GlobMode::Directories);

    results.reserve(results.size() + local.size());
    for (auto& p : local) {
        // Avoid recursing into directories we've already visited (via symlinks).
        std::error_code ec;
        fs::path canonical = fs::weakly_canonical(p, ec);

        if (!ec && visited.emplace(getU8Str(canonical)).second) {
            iterDirectoriesRecursive(canonical, results, visited);
            results.emplace_back(std::move(canonical));
        }
    }
}